

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixOpen(unqlite_vfs *pVfs,char *zPath,unqlite_file *pFile,uint flags)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  sxi32 sVar5;
  ulong uVar6;
  int *piVar7;
  unqlite_io_methods *puVar8;
  unqlite_io_methods *puVar9;
  unixInodeInfo *puVar10;
  UnixUnusedFd **ppUVar11;
  undefined8 uVar12;
  bool bVar13;
  int dirfd;
  unixFileId fileId;
  int local_dc;
  dev_t local_d8;
  ino_t iStack_d0;
  stat local_c0;
  
  local_dc = -1;
  uVar6 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&pFile->pMethods + uVar6 + 4) = 0;
    uVar6 = uVar6 + 4;
  } while (uVar6 < 0x44);
  iVar1 = stat(zPath,&local_c0);
  if ((iVar1 == 0) && (inodeList != (unixInodeInfo *)0x0)) {
    puVar8 = (unqlite_io_methods *)0x0;
    puVar10 = inodeList;
    do {
      if (((puVar10->fileId).dev == local_c0.st_dev) && ((puVar10->fileId).ino == local_c0.st_ino))
      {
        puVar8 = (unqlite_io_methods *)puVar10->pUnused;
        bVar13 = puVar8 == (unqlite_io_methods *)0x0;
        if (!bVar13) {
          if (*(uint *)&puVar8->field_0x4 != flags) goto LAB_0010f473;
          ppUVar11 = &puVar10->pUnused;
          goto LAB_0010f490;
        }
        break;
      }
      puVar10 = puVar10->pNext;
    } while (puVar10 != (unixInodeInfo *)0x0);
  }
  else {
    puVar8 = (unqlite_io_methods *)0x0;
  }
  goto LAB_0010f24d;
  while (*(uint *)&puVar8->field_0x4 != flags) {
LAB_0010f473:
    puVar9 = puVar8;
    puVar8 = (unqlite_io_methods *)puVar9->xClose;
    bVar13 = puVar8 == (unqlite_io_methods *)0x0;
    if (bVar13) goto LAB_0010f24d;
  }
  ppUVar11 = (UnixUnusedFd **)&puVar9->xClose;
LAB_0010f490:
  if (!bVar13) {
    *ppUVar11 = (UnixUnusedFd *)puVar8->xClose;
  }
LAB_0010f24d:
  if (puVar8 == (unqlite_io_methods *)0x0) {
    puVar8 = (unqlite_io_methods *)SyMemBackendAlloc(&sUnqlMPGlobal.sAllocator,0x10);
    iVar1 = -1;
    if (puVar8 == (unqlite_io_methods *)0x0) {
      return -1;
    }
  }
  else {
    iVar1 = puVar8->iVersion;
  }
  pFile[5].pMethods = puVar8;
  if (iVar1 < 0) {
    iVar2 = (flags & 4) * 0x10;
    iVar1 = iVar2 + 0x20080;
    if ((flags & 8) == 0) {
      iVar1 = iVar2;
    }
    uVar12 = 0x180;
    if ((flags & 0x10) == 0) {
      uVar12 = 0x1a4;
    }
    iVar1 = open(zPath,iVar1 + (flags & 2),uVar12);
    if (iVar1 < 0) {
      uVar3 = iVar1 >> 0x1f & 0xfffffffe;
      goto LAB_0010f4f8;
    }
  }
  puVar8 = pFile[5].pMethods;
  if (puVar8 != (unqlite_io_methods *)0x0) {
    puVar8->iVersion = iVar1;
    *(uint *)&puVar8->field_0x4 = flags;
  }
  if ((flags & 0x10) != 0) {
    unlink(zPath);
  }
  if (((flags & 4) == 0) || (uVar3 = openDirectory(zPath,&local_dc), uVar3 == 0)) {
    uVar3 = fcntl(iVar1,1,0);
    fcntl(iVar1,2,(ulong)(uVar3 | 1));
    iVar2 = local_dc;
    *(int *)&pFile[2].pMethods = iVar1;
    *(int *)((long)&pFile[2].pMethods + 4) = local_dc;
    *(undefined4 *)&pFile[6].pMethods = 0;
    pFile[7].pMethods = (unqlite_io_methods *)zPath;
    iVar4 = fstat(iVar1,&local_c0);
    if (iVar4 == 0) {
      local_d8 = local_c0.st_dev;
      iStack_d0 = local_c0.st_ino;
      if (inodeList != (unixInodeInfo *)0x0) {
        puVar8 = (unqlite_io_methods *)inodeList;
        do {
          sVar5 = SyMemcmp(&local_d8,puVar8,0x10);
          if (sVar5 == 0) {
            *(int *)&puVar8->xWrite = *(int *)&puVar8->xWrite + 1;
            puVar9 = (unqlite_io_methods *)inodeList;
            goto LAB_0010f4a8;
          }
          puVar8 = (unqlite_io_methods *)puVar8->xSync;
        } while (puVar8 != (unqlite_io_methods *)0x0);
      }
      puVar8 = (unqlite_io_methods *)SyMemBackendAlloc(&sUnqlMPGlobal.sAllocator,0x38);
      if (puVar8 == (unqlite_io_methods *)0x0) {
        uVar3 = 0xffffffff;
      }
      else {
        puVar8->xTruncate = (_func_int_unqlite_file_ptr_unqlite_int64 *)0x0;
        puVar8->xSync = (_func_int_unqlite_file_ptr_int *)0x0;
        puVar8->xRead = (_func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 *)0x0;
        puVar8->xWrite = (_func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 *)0x0;
        *(undefined8 *)puVar8 = 0;
        puVar8->xClose = (_func_int_unqlite_file_ptr *)0x0;
        puVar8->xFileSize = (_func_int_unqlite_file_ptr_unqlite_int64_ptr *)0x0;
        SyMemcpy(&local_d8,puVar8,0x10);
        *(int *)&puVar8->xWrite = 1;
        puVar8->xSync = (_func_int_unqlite_file_ptr_int *)inodeList;
        puVar8->xFileSize = (_func_int_unqlite_file_ptr_unqlite_int64_ptr *)0x0;
        puVar9 = puVar8;
        if (inodeList != (unixInodeInfo *)0x0) {
          inodeList->pPrev = (unixInodeInfo *)puVar8;
        }
LAB_0010f4a8:
        inodeList = (unixInodeInfo *)puVar9;
        pFile[1].pMethods = puVar8;
        uVar3 = 0;
      }
    }
    else {
      piVar7 = __errno_location();
      iVar4 = *piVar7;
      *(int *)((long)&pFile[3].pMethods + 4) = iVar4;
      uVar3 = 0xfffffffe;
      if (iVar4 == 0x4b) {
        uVar3 = 0xffffffef;
      }
    }
    if (uVar3 != 0) {
      close(iVar1);
      iVar1 = -1;
    }
    *(undefined4 *)((long)&pFile[3].pMethods + 4) = 0;
    if (uVar3 == 0) {
      pFile->pMethods = &unixIoMethod;
      goto LAB_0010f4f8;
    }
    if (-1 < iVar2) {
      close(iVar2);
    }
    if (iVar1 < 0) goto LAB_0010f4f8;
  }
  close(iVar1);
LAB_0010f4f8:
  if (uVar3 != 0) {
    SyMemBackendFree(&sUnqlMPGlobal.sAllocator,pFile[5].pMethods);
  }
  return uVar3;
}

Assistant:

static int unixOpen(
  unqlite_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  unqlite_file *pFile,         /* The file descriptor to be filled in */
  unsigned int flags           /* Input flags to control the opening */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int dirfd = -1;                /* Directory file descriptor */
  int openFlags = 0;             /* Flags to pass to open() */
  int noLock;                    /* True to omit locking primitives */
  int rc = UNQLITE_OK;            /* Function Return Code */
  UnixUnusedFd *pUnused;
  int isExclusive  = (flags & UNQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & UNQLITE_OPEN_TEMP_DB);
  int isCreate     = (flags & UNQLITE_OPEN_CREATE);
  int isReadonly   = (flags & UNQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & UNQLITE_OPEN_READWRITE);
  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
#ifndef UNQLITE_DISABLE_DIRSYNC
  int isOpenDirectory = isCreate;
#endif
  const char *zName = zPath;

  SyZero(p,sizeof(unixFile));
  
  pUnused = findReusableFd(zName, flags);
  if( pUnused ){
	  fd = pUnused->fd;
  }else{
	  pUnused = unqlite_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return UNQLITE_NOMEM;
      }
  }
  p->pUnused = pUnused;
  
  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    rc = findCreateFileMode(zName, flags, &openMode);
    if( rc!=UNQLITE_OK ){
      return rc;
    }
    fd = open(zName, openFlags, openMode);
    if( fd<0 ){
	  rc = UNQLITE_IOERR;
      goto open_finished;
    }
  }
  
  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
    unlink(zName);
  }

#ifndef UNQLITE_DISABLE_DIRSYNC
  if( isOpenDirectory ){
    rc = openDirectory(zPath, &dirfd);
    if( rc!=UNQLITE_OK ){
      /* It is safe to close fd at this point, because it is guaranteed not
      ** to be open on a database file. If it were open on a database file,
      ** it would not be safe to close as this would release any locks held
      ** on the file by this process.  */
      close(fd);             /* silently leak if fail, already in error */
      goto open_finished;
    }
  }
#endif

#ifdef FD_CLOEXEC
  fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif

  noLock = 0;

#if defined(__APPLE__) 
  struct statfs fsInfo;
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    if( dirfd>=0 ) close(dirfd); /* silently leak if fail, in error */
    close(fd); /* silently leak if fail, in error */
    return UNQLITE_IOERR;
  }
  if (0 == SyStrncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= UNQLITE_FSFLAGS_IS_MSDOS;
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, dirfd, pFile, zPath, noLock, isDelete);
open_finished:
  if( rc!=UNQLITE_OK ){
    unqlite_free(p->pUnused);
  }
  return rc;
}